

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  input id;
  string s;
  istream in;
  ios_base local_310 [8];
  ostream local_308 [16];
  byte abStack_2f8 [256];
  output od;
  string test;
  input id_7;
  streambuf buf;
  ios_base local_130 [24];
  byte abStack_118 [240];
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing input device");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string((string *)&test,"Hello World\ndone",(allocator *)&in);
  id.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107c60;
  id.pos = 0;
  id.buf = &test;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::device((io_device *)&buf);
  std::istream::istream(&in,(streambuf *)&buf);
  paVar1 = &s.field_2;
  s._M_string_length = 0;
  s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
  s._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"Hello");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," s==\"Hello\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x79);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"World");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," s==\"World\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7b);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"done");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," s==\"done\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7d);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 2) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.eof()");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7e);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::__cxx11::string::~string((string *)&s);
  std::istream::~istream(&in);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing input device, small buffer");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string((string *)&test,"Hello World\ndone",(allocator *)&in);
  id.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107c60;
  id.pos = 0;
  id.buf = &test;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::set_buffer_size((ulong)&buf);
  booster::streambuf::device((io_device *)&buf);
  std::istream::istream(&in,(streambuf *)&buf);
  s._M_string_length = 0;
  s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
  s._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"Hello");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," s==\"Hello\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8a);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"World");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," s==\"World\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8c);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"done");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," s==\"done\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8e);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 2) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.eof()");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8f);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::__cxx11::string::~string((string *)&s);
  std::istream::~istream(&in);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing input device, putback");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string((string *)&test,"Hello World\ndone",(allocator *)&in);
  id.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107c60;
  id.pos = 0;
  id.buf = &test;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::set_buffer_size((ulong)&buf);
  booster::streambuf::device((io_device *)&buf);
  std::istream::istream(&in,(streambuf *)&buf);
  s._M_string_length = 0;
  s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
  tests = tests + 1;
  s._M_dataplus._M_p = (pointer)paVar1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x48) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'H\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9a);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x65) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'e\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9b);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6c) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9c);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6c) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9d);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::putback((char)&in);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.putback(\'l\')");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9e);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::putback((char)&in);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.putback(\'l\')");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x9f);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::putback((char)&in);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.putback(\'e\')");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa0);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x65) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'e\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa1);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6c) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa2);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6c) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa3);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6f) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'o\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa4);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::putback((char)&in);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.putback(\'o\')");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa5);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6f) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'o\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa6);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x20) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \' \'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa7);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::unget();
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.unget()");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa8);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x20) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \' \'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa9);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::putback((char)&in);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," !in.putback(\'x\')");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xaa);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::__cxx11::string::~string((string *)&s);
  std::istream::~istream(&in);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing input device, putback fail");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string((string *)&test,"Hello World\ndone",(allocator *)&in);
  id.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107c60;
  id.pos = 0;
  id.buf = &test;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::set_buffer_size((ulong)&buf);
  booster::streambuf::device((io_device *)&buf);
  std::istream::istream(&in,(streambuf *)&buf);
  s._M_string_length = 0;
  s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
  tests = tests + 1;
  s._M_dataplus._M_p = (pointer)paVar1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x48) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'H\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb5);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x65) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'e\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb6);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6c) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb7);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::get();
  if (iVar5 != 0x6c) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in.get() == \'l\'");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb8);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::unget();
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
    plVar7 = (long *)std::istream::unget();
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      plVar7 = (long *)std::istream::unget();
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr," !in.unget() || !in.unget() || !in.unget()")
        ;
        poVar6 = std::operator<<(poVar6," in ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb9);
        poVar6 = std::operator<<(poVar6," failed");
        std::endl<char,std::char_traits<char>>(poVar6);
        errors = errors + 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)&s);
  std::istream::~istream(&in);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing output device");
  std::endl<char,std::char_traits<char>>(poVar6);
  paVar2 = &test.field_2;
  test._M_string_length = 0;
  test.field_2._M_allocated_capacity = test.field_2._M_allocated_capacity & 0xffffffffffffff00;
  s._M_dataplus._M_p = (pointer)&PTR_read_00107cc0;
  s._M_string_length = 5;
  s.field_2._M_allocated_capacity = (size_type)&test;
  test._M_dataplus._M_p = (pointer)paVar2;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::device((io_device *)&buf);
  std::ostream::ostream(&in,(streambuf *)&buf);
  std::operator<<((ostream *)&in,"test");
  tests = tests + 1;
  bVar3 = std::operator==(&test,"");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test==\"\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc3);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ostream::flush();
  tests = tests + 1;
  bVar3 = std::operator==(&test,"test");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test==\"test\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc5);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," out");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc6);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator<<((ostream *)&in,"ab");
  std::ostream::flush();
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," !out");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,200);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  bVar3 = std::operator==(&test,"testa");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test==\"testa\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc9);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing output device, small buffer size");
  std::endl<char,std::char_traits<char>>(poVar6);
  test._M_string_length = 0;
  test.field_2._M_allocated_capacity = test.field_2._M_allocated_capacity & 0xffffffffffffff00;
  id.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107cc0;
  id.pos = 0xffffffffffffffff;
  id.buf = &test;
  test._M_dataplus._M_p = (pointer)paVar2;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::set_buffer_size((ulong)&buf);
  booster::streambuf::device((io_device *)&buf);
  std::ostream::ostream(&in,(streambuf *)&buf);
  std::__cxx11::string::string
            ((string *)&s,"To be or not to be, that is the question!",(allocator *)&od);
  std::operator<<((ostream *)&in,(string *)&s);
  tests = tests + 1;
  if (test._M_string_length < s._M_string_length - 3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test_msg.size() - 3 <= test.size()");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd5);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if (s._M_string_length < test._M_string_length) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test.size() <= test_msg.size()");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd6);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ostream::flush();
  tests = tests + 1;
  _Var4 = std::operator==(&test,&s);
  if (!_Var4) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test==test_msg");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd8);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::__cxx11::string::~string((string *)&s);
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing output device, reset");
  std::endl<char,std::char_traits<char>>(poVar6);
  test._M_string_length = 0;
  test.field_2._M_allocated_capacity = test.field_2._M_allocated_capacity & 0xffffffffffffff00;
  s._M_dataplus._M_p = (pointer)&PTR_read_00107cc0;
  s._M_string_length = 0xffffffffffffffff;
  s.field_2._M_allocated_capacity = (size_type)&test;
  test._M_dataplus._M_p = (pointer)paVar2;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::device((io_device *)&buf);
  std::ostream::ostream(&in,(streambuf *)&buf);
  std::operator<<((ostream *)&in,"test");
  booster::streambuf::reset_device();
  tests = tests + 1;
  bVar3 = std::operator==(&test,"test");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," test==\"test\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe3);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf(&buf);
  std::__cxx11::string::~string((string *)&test);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing seek fault");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string((string *)&id,"foo",(allocator *)&in);
  od.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107cc0;
  od.lim = 0xffffffffffffffff;
  od.buf = (string *)&id;
  booster::streambuf::streambuf((streambuf *)&test);
  booster::streambuf::device((io_device *)&test);
  booster::streambuf::streambuf((streambuf *)&s);
  booster::streambuf::device((io_device *)&s);
  std::istream::istream(&in,(streambuf *)&s);
  std::ostream::ostream(&buf,(streambuf *)&test);
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf0);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_118[*(long *)(_buf + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," out");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf1);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::istream::seekg(&in,0,0);
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," !in");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf3);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ostream::seekp(&buf,0,0);
  tests = tests + 1;
  if ((abStack_118[*(long *)(_buf + -0x18)] & 5) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," !out");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf5);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ios_base::~ios_base(local_130);
  std::istream::~istream(&in);
  booster::streambuf::~streambuf((streambuf *)&s);
  booster::streambuf::~streambuf((streambuf *)&test);
  std::__cxx11::string::~string((string *)&id);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing tell fault");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::string((string *)&id,"foo",(allocator *)&in);
  od.super_io_device._vptr_io_device = (_func_int **)&PTR_read_00107cc0;
  od.lim = 0xffffffffffffffff;
  od.buf = (string *)&id;
  booster::streambuf::streambuf((streambuf *)&test);
  booster::streambuf::device((io_device *)&test);
  booster::streambuf::streambuf((streambuf *)&s);
  booster::streambuf::device((io_device *)&s);
  std::istream::istream(&in,(streambuf *)&s);
  std::ostream::ostream(&buf,(streambuf *)&test);
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," in");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x102);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_118[*(long *)(_buf + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," out");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x103);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::tellg();
  if (iVar5 != -1) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(in.tellg())==-1");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x104);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::ostream::tellp();
  if (iVar5 != -1) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(out.tellp())==-1");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x105);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ios_base::~ios_base(local_130);
  std::istream::~istream(&in);
  booster::streambuf::~streambuf((streambuf *)&s);
  booster::streambuf::~streambuf((streambuf *)&test);
  std::__cxx11::string::~string((string *)&id);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing random access device");
  std::endl<char,std::char_traits<char>>(poVar6);
  test._M_dataplus._M_p = ",\\\x10";
  test._M_string_length = 0;
  test.field_2._M_allocated_capacity = 0;
  test.field_2._8_8_ = 0;
  booster::streambuf::streambuf(&buf);
  booster::streambuf::device((io_device *)&buf);
  std::iostream::iostream(&in,(streambuf *)&buf);
  tests = tests + 1;
  iVar5 = std::istream::tellg();
  if (iVar5 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==0");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10e);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::ostream::tellp();
  if (iVar5 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==0");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10f);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator<<(local_308,"test");
  tests = tests + 1;
  iVar5 = std::istream::tellg();
  if (iVar5 != 4) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==4");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x111);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::ostream::tellp();
  if (iVar5 != 4) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==4");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x112);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x113);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::ostream::seekp(local_308,1,0);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io.seekp(1)");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x114);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator<<(local_308,"x");
  tests = tests + 1;
  iVar5 = std::ostream::tellp();
  if (iVar5 != 2) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==2");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x116);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::seekg(&in,0,0);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io.seekg(0)");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x117);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x118);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  s._M_string_length = 0;
  s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
  s._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"txst");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," tmp==\"txst\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11b);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  lVar8 = *(long *)(_in + -0x18);
  if ((abStack_2f8[lVar8] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11c);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
    lVar8 = *(long *)(_in + -0x18);
  }
  std::ios::clear((int)&id + (int)lVar8 + 0xb0);
  tests = tests + 1;
  iVar5 = std::istream::tellg();
  if (iVar5 != 4) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==4");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11e);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::ostream::tellp();
  if (iVar5 != 4) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==4");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11f);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::ios::clear((int)&in + (int)*(undefined8 *)(_in + -0x18));
  std::operator<<(local_308,"xxxx");
  tests = tests + 1;
  if ((abStack_2f8[*(long *)(_in + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x122);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::ostream::tellp();
  if (iVar5 != 8) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellp())==8");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x123);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar5 = std::istream::tellg();
  if (iVar5 != 8) {
    poVar6 = std::operator<<((ostream *)&std::cerr," int(io.tellg())==8");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x124);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar7 = (long *)std::istream::seekg(&in,0,0);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr," io.seekg(0)");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x125);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::operator>>(&in,(string *)&s);
  tests = tests + 1;
  bVar3 = std::operator==(&s,"txstxxxx");
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr," tmp==\"txstxxxx\"");
    poVar6 = std::operator<<(poVar6," in ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x127);
    poVar6 = std::operator<<(poVar6," failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    errors = errors + 1;
  }
  std::__cxx11::string::~string((string *)&s);
  std::iostream::~iostream(&in);
  booster::streambuf::~streambuf(&buf);
  seekable::~seekable((seekable *)&test);
  bVar3 = errors == 0;
  if (bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cout,"ok, passed ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,tests);
    poVar6 = std::operator<<(poVar6," tests ");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Fail: passed ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,tests - errors);
    poVar6 = std::operator<<(poVar6," tests ");
    poVar6 = std::operator<<(poVar6," failed ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,errors);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return (uint)!bVar3;
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Testing input device" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			in >> s ;
			TEST(s=="Hello");
			in >> s;
			TEST(s=="World");
			in >> s;
			TEST(s=="done");
			TEST(in.eof());
		}
		{
			std::cout << "Testing input device, small buffer" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			in >> s ;
			TEST(s=="Hello");
			in >> s;
			TEST(s=="World");
			in >> s;
			TEST(s=="done");
			TEST(in.eof());
		}
		{
			std::cout << "Testing input device, putback" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			TEST(in.get() == 'H');
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(in.putback('l'));
			TEST(in.putback('l'));
			TEST(in.putback('e'));
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(in.get() == 'o');
			TEST(in.putback('o'));
			TEST(in.get() == 'o');
			TEST(in.get() == ' ');
			TEST(in.unget());
			TEST(in.get() == ' ');
			TEST(!in.putback('x'));
		}
		{
			std::cout << "Testing input device, putback fail" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			TEST(in.get() == 'H');
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(!in.unget() || !in.unget() || !in.unget());
		}
		{
			std::cout << "Testing output device" << std::endl;
			std::string test;
			output id(&test,5);
			booster::streambuf buf;
			buf.device(id);
			std::ostream out(&buf);
			out << "test";
			TEST(test=="");
			out << std::flush;
			TEST(test=="test");
			TEST(out);
			out << "ab" << std::flush;
			TEST(!out);
			TEST(test=="testa");
		}
		{
			std::cout << "Testing output device, small buffer size" << std::endl;
			std::string test;
			output id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::ostream out(&buf);
			std::string test_msg = "To be or not to be, that is the question!";
			out << test_msg;
			TEST(test_msg.size() - 3 <= test.size());
			TEST(test.size() <= test_msg.size());
			out << std::flush;
			TEST(test==test_msg);
		}
		{
			std::cout << "Testing output device, reset" << std::endl;
			std::string test;
			output id(&test);
			booster::streambuf buf;
			buf.device(id);
			std::ostream out(&buf);
			out << "test";
			buf.reset_device();
			TEST(test=="test");
		}
		{
			std::cout << "Testing seek fault" << std::endl;
			std::string dummy="foo";
			output od(&dummy);
			input id(&dummy);
			booster::streambuf os;
			os.device(od);
			booster::streambuf is;
			is.device(id);
			std::istream in(&is);
			std::ostream out(&os);
			TEST(in);
			TEST(out);
			in.seekg(0);
			TEST(!in);
			out.seekp(0);
			TEST(!out);
		}
		{
			std::cout << "Testing tell fault" << std::endl;
			std::string dummy="foo";
			output od(&dummy);
			input id(&dummy);
			booster::streambuf os;
			os.device(od);
			booster::streambuf is;
			is.device(id);
			std::istream in(&is);
			std::ostream out(&os);
			TEST(in);
			TEST(out);
			TEST(int(in.tellg())==-1);
			TEST(int(out.tellp())==-1);
		}
		{
			std::cout << "Testing random access device" << std::endl;
			seekable sd;
			booster::streambuf buf;
			buf.device(sd);
			std::iostream io(&buf);
			
			TEST(int(io.tellg())==0);
			TEST(int(io.tellp())==0);
			io << "test";
			TEST(int(io.tellg())==4);
			TEST(int(io.tellp())==4);
			TEST(io);
			TEST(io.seekp(1));
			io << "x";
			TEST(int(io.tellp())==2);
			TEST(io.seekg(0));
			TEST(io);
			std::string tmp;
			io >> tmp;
			TEST(tmp=="txst");
			TEST(io);
			io.clear();
			TEST(int(io.tellg())==4);
			TEST(int(io.tellp())==4);
			io.clear();
			io << "xxxx";
			TEST(io);
			TEST(int(io.tellp())==8);
			TEST(int(io.tellg())==8);
			TEST(io.seekg(0));
			io >> tmp;
			TEST(tmp=="txstxxxx");
		}
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}
	if(errors == 0) {
		std::cout << "ok, passed " << tests << " tests "<< std::endl;
		return 0;
	}
	else { 
		std::cerr << "Fail: passed " << tests - errors<< " tests " << " failed " << errors << std::endl;
		return 1;
	}

}